

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_cb(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  DESCRIPTOR_DATA *d;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffecf8;
  CHAR_DATA *in_stack_ffffffffffffed00;
  CHAR_DATA *in_stack_ffffffffffffed08;
  CHAR_DATA *in_stack_ffffffffffffed10;
  CHAR_DATA *in_stack_ffffffffffffed18;
  char *local_12c8;
  char *local_1290;
  char *local_1260;
  DESCRIPTOR_DATA *local_1220;
  CHAR_DATA local_1218 [5];
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  CHAR_DATA *in_stack_ffffffffffffff08;
  
  bVar2 = is_affected_area(in_RDI->in_room->area,(int)gsn_interference);
  if (bVar2) {
    send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
  }
  else {
    bVar2 = is_cabal(in_RDI);
    if ((bVar2) && ((cabal_table[in_RDI->cabal].independent & 1U) == 0)) {
      if (*in_RSI == '\0') {
        uVar1 = in_RDI->comm[0];
        _Var5 = std::pow<int,int>(0,0x5231f2);
        if ((uVar1 & (long)_Var5) == 0) {
          send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
          _Var5 = std::pow<int,int>(0,0x52326f);
          in_RDI->comm[0] = (long)_Var5 | in_RDI->comm[0];
        }
        else {
          send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
          _Var5 = std::pow<int,int>(0,0x52322b);
          in_RDI->comm[0] = ((long)_Var5 ^ 0xffffffffffffffffU) & in_RDI->comm[0];
        }
      }
      else {
        bVar2 = is_shifted(in_RDI);
        if ((!bVar2) || (bVar2 = is_immortal(in_stack_ffffffffffffecf8), bVar2)) {
          bVar2 = is_affected(in_RDI,(int)gsn_silence);
          if (bVar2) {
            send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
          }
          else {
            uVar1 = in_RDI->in_room->room_flags[0];
            _Var5 = std::pow<int,int>(0,0x52332f);
            if ((uVar1 & (long)_Var5) == 0) {
              uVar1 = in_RDI->comm[0];
              _Var5 = std::pow<int,int>(0,0x523384);
              if ((uVar1 & (long)_Var5) == 0) {
                bVar2 = is_affected(in_RDI,(int)gsn_imprisonvoice);
                if (bVar2) {
                  send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
                }
                else {
                  bVar2 = is_affected(in_RDI,(int)gsn_gag);
                  if (bVar2) {
                    send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
                  }
                  else {
                    check_ooc(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8);
                    bVar2 = is_affected(in_RDI,(int)gsn_deafen);
                    if (bVar2) {
                      pcVar3 = upstring(in_RSI);
                      sprintf(in_RSI,"%s",pcVar3);
                    }
                    _Var5 = std::pow<int,int>(0,0x52349d);
                    in_RDI->comm[0] = ((long)_Var5 ^ 0xffffffffffffffffU) & in_RDI->comm[0];
                    uVar1 = in_RDI->comm[0];
                    _Var5 = std::pow<int,int>(0,0x5234e2);
                    if ((uVar1 & (long)_Var5) == 0) {
                      pcVar3 = cabal_table[in_RDI->cabal].who_name;
                      bVar2 = is_npc(in_stack_ffffffffffffecf8);
                      if (bVar2) {
                        local_1290 = in_RDI->short_descr;
                      }
                      else {
                        local_1290 = in_RDI->name;
                      }
                      sprintf((char *)local_1218,"%s%s: %s\n\r",pcVar3,local_1290,in_RSI);
                    }
                    else {
                      pcVar3 = cabal_table[in_RDI->cabal].who_name;
                      bVar2 = is_npc(in_stack_ffffffffffffecf8);
                      if (bVar2) {
                        local_1260 = in_RDI->short_descr;
                      }
                      else {
                        local_1260 = in_RDI->true_name;
                      }
                      pcVar4 = get_char_color(in_stack_ffffffffffffed18,
                                              (char *)in_stack_ffffffffffffed10);
                      in_stack_ffffffffffffecf8 = (CHAR_DATA *)END_COLOR(in_stack_ffffffffffffed08);
                      sprintf((char *)local_1218,"%s%s: %s%s%s\n\r",pcVar3,local_1260,pcVar4,in_RSI)
                      ;
                    }
                    send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
                    for (local_1220 = descriptor_list; local_1220 != (DESCRIPTOR_DATA *)0x0;
                        local_1220 = local_1220->next) {
                      if (((local_1220->connected == 0) && (local_1220->character != in_RDI)) &&
                         (((bVar2 = is_same_cabal(in_RDI,local_1220->character), bVar2 &&
                           ((uVar1 = local_1220->character->comm[0],
                            _Var5 = std::pow<int,int>(0,0x52374e), (uVar1 & (long)_Var5) == 0 &&
                            (uVar1 = local_1220->character->in_room->room_flags[0],
                            _Var5 = std::pow<int,int>(0,0x52378f), (uVar1 & (long)_Var5) == 0)))) ||
                          (uVar1 = local_1220->character->comm[0],
                          _Var5 = std::pow<int,int>(0,0x5237c9), (uVar1 & (long)_Var5) != 0)))) {
                        uVar1 = local_1220->character->comm[0];
                        _Var5 = std::pow<int,int>(0,0x523807);
                        if ((uVar1 & (long)_Var5) == 0) {
                          in_stack_ffffffffffffed10 = local_1218;
                          in_stack_ffffffffffffed18 =
                               (CHAR_DATA *)cabal_table[in_RDI->cabal].who_name;
                          bVar2 = is_npc(in_stack_ffffffffffffecf8);
                          if ((bVar2) ||
                             (bVar2 = can_see(in_stack_ffffffffffffed18,in_stack_ffffffffffffed10),
                             !bVar2)) {
                            in_stack_ffffffffffffed08 =
                                 (CHAR_DATA *)
                                 pers(in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
                          }
                          else {
                            in_stack_ffffffffffffed08 = (CHAR_DATA *)in_RDI->true_name;
                          }
                          sprintf((char *)in_stack_ffffffffffffed10,"%s%s: %s\n\r",
                                  in_stack_ffffffffffffed18,in_stack_ffffffffffffed08,in_RSI);
                        }
                        else {
                          pcVar3 = cabal_table[in_RDI->cabal].who_name;
                          bVar2 = is_npc(in_stack_ffffffffffffecf8);
                          if ((bVar2) ||
                             (bVar2 = can_see(in_stack_ffffffffffffed18,in_stack_ffffffffffffed10),
                             !bVar2)) {
                            local_12c8 = pers(in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
                          }
                          else {
                            local_12c8 = in_RDI->true_name;
                          }
                          pcVar4 = get_char_color(in_stack_ffffffffffffed18,
                                                  (char *)in_stack_ffffffffffffed10);
                          in_stack_ffffffffffffecf8 =
                               (CHAR_DATA *)END_COLOR(in_stack_ffffffffffffed08);
                          sprintf((char *)local_1218,"%s%s: %s%s%s\n\r",pcVar3,local_12c8,pcVar4,
                                  in_RSI);
                        }
                        send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
                      }
                    }
                  }
                }
              }
              else {
                send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
              }
            }
            else {
              send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
            }
          }
        }
        else {
          send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
        }
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
    }
  }
  return;
}

Assistant:

void do_cb(CHAR_DATA *ch, char *argument)
{
	if (is_affected_area(ch->in_room->area, gsn_interference))
	{
		send_to_char("The electrical currents in the area block your attempt to communicate.\n\r", ch);
		return;
	}

	if (!is_cabal(ch) || cabal_table[ch->cabal].independent)
	{
		send_to_char("You aren't in a cabal.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->comm, COMM_NOCABAL))
		{
			send_to_char("Cabal channel is now ON\n\r", ch);
			REMOVE_BIT(ch->comm, COMM_NOCABAL);
		}
		else
		{
			send_to_char("Cabal channel is now OFF\n\r", ch);
			SET_BIT(ch->comm, COMM_NOCABAL);
		}

		return;
	}

	if (is_shifted(ch) && !is_immortal(ch))
	{
		send_to_char("You can't seem to form the words.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_silence))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->in_room->room_flags, ROOM_SILENCE))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_NOCHANNELS))
	{
		send_to_char("The gods have revoked your channel privileges.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_imprisonvoice))
	{
		send_to_char("Your vocal cords are frozen solid!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_gag))
	{
		send_to_char("You are gagged and cannot speak!\n\r", ch);
		return;
	}

	check_ooc(ch, argument, "CB");

	if (is_affected(ch, gsn_deafen))
		sprintf(argument, "%s", upstring(argument));

	REMOVE_BIT(ch->comm, COMM_NOCABAL);

	char buf[MAX_STRING_LENGTH];
	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf, "%s%s: %s%s%s\n\r",
				cabal_table[ch->cabal].who_name,
				is_npc(ch) ? ch->short_descr : ch->true_name,
				get_char_color(ch, "channels"),
				argument,
				END_COLOR(ch));
	}
	else
	{
		sprintf(buf, "%s%s: %s\n\r",
				cabal_table[ch->cabal].who_name,
				is_npc(ch) ? ch->short_descr : ch->name,
				argument);
	}

	send_to_char(buf, ch);

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character != ch && ((is_same_cabal(ch, d->character) && !IS_SET(d->character->comm, COMM_NOCABAL) && !IS_SET(d->character->in_room->room_flags, ROOM_SILENCE)) || IS_SET(d->character->comm, COMM_ALL_CABALS)))
		{
			if (IS_SET(d->character->comm, COMM_ANSI))
			{
				sprintf(buf, "%s%s: %s%s%s\n\r",
						cabal_table[ch->cabal].who_name,
						!is_npc(ch) && can_see(d->character, ch) ? ch->true_name : pers(ch, d->character),
						get_char_color(d->character, "channels"),
						argument,
						END_COLOR(d->character));
			}
			else
			{
				sprintf(buf, "%s%s: %s\n\r",
						cabal_table[ch->cabal].who_name,
						!is_npc(ch) && can_see(d->character, ch) ? ch->true_name : pers(ch, d->character),
						argument);
			}

			send_to_char(buf, d->character);
		}
	}
}